

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

int type_eq_p(type *type1,type *type2)

{
  type_mode tVar1;
  func_type *pfVar2;
  func_type *pfVar3;
  node_t pnVar4;
  arr_type *paVar5;
  arr_type *paVar6;
  byte *pbVar7;
  byte *pbVar8;
  int iVar9;
  long lVar10;
  decl_spec *pdVar11;
  decl_spec *pdVar12;
  long lVar13;
  uint uVar14;
  node_t_conflict p1;
  node_t param;
  node_t pnVar15;
  bool bVar16;
  
  while( true ) {
    tVar1 = type1->mode;
    uVar14 = 0;
    if (tVar1 != type2->mode) {
      return 0;
    }
    if (((*(byte *)&type2->type_qual ^ *(byte *)&type1->type_qual) & 0xf) != 0) {
      return 0;
    }
    if (tVar1 != TM_PTR) break;
    type1 = (type1->u).ptr_type;
    type2 = (type2->u).ptr_type;
  }
  switch(tVar1) {
  case TM_BASIC:
    bVar16 = (type1->u).basic_type == (type2->u).basic_type;
    break;
  case TM_ENUM:
  case TM_STRUCT:
  case TM_UNION:
    bVar16 = (type1->u).tag_type == (type2->u).tag_type;
    break;
  default:
    goto switchD_0018b1d1_caseD_3;
  case TM_ARR:
    paVar5 = (type1->u).arr_type;
    paVar6 = (type2->u).arr_type;
    if (((*(byte *)paVar6 ^ *(byte *)paVar5) & 1) != 0) {
      return 0;
    }
    iVar9 = type_eq_p(paVar5->el_type,paVar6->el_type);
    if (iVar9 == 0) {
      return 0;
    }
    if (((*(byte *)&paVar6->ind_type_qual ^ *(byte *)&paVar5->ind_type_qual) & 0xf) != 0) {
      return 0;
    }
    if (paVar5->size->code == N_IGNORE) {
      return 0;
    }
    if (paVar6->size->code == N_IGNORE) {
      return 0;
    }
    pbVar7 = (byte *)paVar5->size->attr;
    if ((*pbVar7 & 1) == 0) {
      return 0;
    }
    pbVar8 = (byte *)paVar6->size->attr;
    if ((*pbVar8 & 1) == 0) {
      return 0;
    }
    lVar10 = *(long *)(pbVar8 + 0x18);
    iVar9 = *(int *)(lVar10 + 0x18);
    bVar16 = false;
    if (iVar9 == 1) {
      bVar16 = *(int *)(lVar10 + 0x30) - 2U < 0xc;
    }
    if ((iVar9 != 2) && (!bVar16)) {
      return 0;
    }
    bVar16 = false;
    if (iVar9 == 1) {
      bVar16 = *(int *)(lVar10 + 0x30) - 2U < 0xc;
    }
    if ((iVar9 != 2) && (!bVar16)) {
      return 0;
    }
    bVar16 = *(long *)(pbVar7 + 0x30) == *(long *)(pbVar8 + 0x30);
    break;
  case TM_FUNC:
    pfVar2 = (type1->u).func_type;
    pfVar3 = (type2->u).func_type;
    if ((((*(byte *)pfVar3 ^ *(byte *)pfVar2) & 1) == 0) &&
       (iVar9 = type_eq_p(pfVar2->ret_type,pfVar3->ret_type), iVar9 != 0)) {
      lVar10 = 0;
      param = (pfVar2->param_list->u).ops.head;
      for (pnVar15 = param; pnVar15 != (node_t)0x0; pnVar15 = (pnVar15->op_link).next) {
        lVar10 = lVar10 + 1;
      }
      uVar14 = 0;
      lVar13 = 0;
      pnVar15 = (pfVar3->param_list->u).ops.head;
      for (pnVar4 = pnVar15; pnVar4 != (node_t)0x0; pnVar4 = (pnVar4->op_link).next) {
        lVar13 = lVar13 + 1;
      }
      if (lVar10 == lVar13) {
        bVar16 = param == (node_t)0x0;
        if (!bVar16) {
          while( true ) {
            pdVar11 = get_param_decl_spec(param);
            pdVar12 = get_param_decl_spec(pnVar15);
            iVar9 = type_eq_p(pdVar11->type,pdVar12->type);
            if (iVar9 == 0) break;
            param = (param->op_link).next;
            bVar16 = param == (node_t)0x0;
            if (bVar16) break;
            pnVar15 = (pnVar15->op_link).next;
          }
        }
        uVar14 = (uint)bVar16;
      }
    }
    goto switchD_0018b1d1_caseD_3;
  }
  uVar14 = (uint)bVar16;
switchD_0018b1d1_caseD_3:
  return uVar14;
}

Assistant:

static int type_eq_p (struct type *type1, struct type *type2) {
  if (type1->mode != type2->mode) return FALSE;
  if (!type_qual_eq_p (&type1->type_qual, &type2->type_qual)) return FALSE;
  switch (type1->mode) {
  case TM_BASIC: return type1->u.basic_type == type2->u.basic_type;
  case TM_ENUM:
  case TM_STRUCT:
  case TM_UNION: return type1->u.tag_type == type2->u.tag_type;
  case TM_PTR: return type_eq_p (type1->u.ptr_type, type2->u.ptr_type);
  case TM_ARR: {
    struct expr *cexpr1, *cexpr2;
    struct arr_type *at1 = type1->u.arr_type, *at2 = type2->u.arr_type;

    return (at1->static_p == at2->static_p && type_eq_p (at1->el_type, at2->el_type)
            && type_qual_eq_p (&at1->ind_type_qual, &at2->ind_type_qual)
            && at1->size->code != N_IGNORE && at2->size->code != N_IGNORE
            && (cexpr1 = at1->size->attr)->const_p && (cexpr2 = at2->size->attr)->const_p
            && integer_type_p (cexpr2->type) && integer_type_p (cexpr2->type)
            && cexpr1->c.i_val == cexpr2->c.i_val);
  }
  case TM_FUNC: {
    struct func_type *ft1 = type1->u.func_type, *ft2 = type2->u.func_type;
    struct decl_spec *ds1, *ds2;

    if (ft1->dots_p != ft2->dots_p || !type_eq_p (ft1->ret_type, ft2->ret_type)
        || NL_LENGTH (ft1->param_list->u.ops) != NL_LENGTH (ft2->param_list->u.ops))
      return FALSE;
    for (node_t p1 = NL_HEAD (ft1->param_list->u.ops), p2 = NL_HEAD (ft2->param_list->u.ops);
         p1 != NULL; p1 = NL_NEXT (p1), p2 = NL_NEXT (p2)) {
      ds1 = get_param_decl_spec (p1);
      ds2 = get_param_decl_spec (p2);
      if (!type_eq_p (ds1->type, ds2->type)) return FALSE;
      // ??? other qualifiers
    }
    return TRUE;
  }
  default: return FALSE;
  }
}